

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

TValue * luaH_get(Table *t,TValue *key)

{
  double dVar1;
  int iVar2;
  TValue *pTVar3;
  Node *pNVar4;
  
  iVar2 = key->tt;
  if (iVar2 != 0) {
    if (iVar2 == 3) {
      dVar1 = (key->value).n;
      if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
        pTVar3 = luaH_getnum(t,(int)dVar1);
        return pTVar3;
      }
    }
    else if (iVar2 == 4) {
      pNVar4 = t->node + (int)(~(uint)(-1L << (t->lsizenode & 0x3f)) &
                              *(uint *)((long)(key->value).gc + 0xc));
      while (((pNVar4->i_key).nk.tt != 4 || ((pNVar4->i_key).nk.value.gc != (key->value).gc))) {
        pNVar4 = (pNVar4->i_key).nk.next;
        if (pNVar4 == (Node *)0x0) {
          return &luaO_nilobject_;
        }
      }
      return &pNVar4->i_val;
    }
    pNVar4 = mainposition(t,key);
    do {
      iVar2 = luaO_rawequalObj(&(pNVar4->i_key).tvk,key);
      if (iVar2 != 0) {
        return &pNVar4->i_val;
      }
      pNVar4 = (pNVar4->i_key).nk.next;
    } while (pNVar4 != (Node *)0x0);
  }
  return &luaO_nilobject_;
}

Assistant:

static const TValue*luaH_get(Table*t,const TValue*key){
switch(ttype(key)){
case 0:return(&luaO_nilobject_);
case 4:return luaH_getstr(t,rawtsvalue(key));
case 3:{
int k;
lua_Number n=nvalue(key);
lua_number2int(k,n);
if(luai_numeq(cast_num(k),nvalue(key)))
return luaH_getnum(t,k);
}
default:{
Node*n=mainposition(t,key);
do{
if(luaO_rawequalObj(key2tval(n),key))
return gval(n);
else n=gnext(n);
}while(n);
return(&luaO_nilobject_);
}
}
}